

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O2

void __thiscall
cmComputeLinkDepends::AddVarLinkEntries(cmComputeLinkDepends *this,int depender_index,char *value)

{
  bool bVar1;
  int iVar2;
  char *__s1;
  bool bVar3;
  bool bVar4;
  cmTargetLinkLibraryType cVar5;
  pointer __lhs;
  cmTargetLinkLibraryType cVar6;
  string var;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  deplist;
  vector<cmLinkItem,_std::allocator<cmLinkItem>_> actual_libs;
  
  deplist.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  deplist.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  deplist.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&var,value,(allocator *)&actual_libs);
  cVar6 = GENERAL_LibraryType;
  cmSystemTools::ExpandListArgument(&var,&deplist,false);
  std::__cxx11::string::~string((string *)&var);
  actual_libs.super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  actual_libs.super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  actual_libs.super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar4 = false;
  __lhs = deplist.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (__lhs == deplist.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish) {
      AddLinkEntries<cmLinkItem>(this,depender_index,&actual_libs);
      std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::~vector(&actual_libs);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&deplist);
      return;
    }
    bVar1 = std::operator==(__lhs,"debug");
    bVar3 = true;
    if (bVar1) {
      cVar5 = DEBUG_LibraryType;
    }
    else {
      bVar1 = std::operator==(__lhs,"optimized");
      if (bVar1) {
        cVar5 = OPTIMIZED_LibraryType;
      }
      else {
        bVar1 = std::operator==(__lhs,"general");
        cVar5 = GENERAL_LibraryType;
        if ((!bVar1) && (cVar5 = cVar6, bVar3 = bVar4, __lhs->_M_string_length != 0)) {
          if (!bVar4) {
            std::__cxx11::string::string((string *)&var,(string *)__lhs);
            std::__cxx11::string::append((char *)&var);
            __s1 = cmMakefile::GetDefinition(this->Makefile,&var);
            if (__s1 != (char *)0x0) {
              iVar2 = strcmp(__s1,"debug");
              cVar5 = DEBUG_LibraryType;
              if ((iVar2 != 0) && (iVar2 = strcmp(__s1,"optimized"), cVar5 = cVar6, iVar2 == 0)) {
                cVar5 = OPTIMIZED_LibraryType;
              }
            }
            std::__cxx11::string::~string((string *)&var);
          }
          if ((cVar5 == GENERAL_LibraryType) || (cVar5 == this->LinkType)) {
            FindTargetToLink(this,depender_index,__lhs);
            std::__cxx11::string::string((string *)&var,(string *)__lhs);
            std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::push_back
                      (&actual_libs,(value_type *)&var);
          }
          else {
            cVar5 = GENERAL_LibraryType;
            bVar3 = false;
            if (this->OldLinkDirMode != true) goto LAB_00445975;
            FindTargetToLink(this,depender_index,__lhs);
            std::__cxx11::string::string((string *)&var,(string *)__lhs);
            CheckWrongConfigItem(this,(cmLinkItem *)&var);
          }
          std::__cxx11::string::~string((string *)&var);
          cVar5 = GENERAL_LibraryType;
          bVar3 = false;
        }
      }
    }
LAB_00445975:
    bVar4 = bVar3;
    cVar6 = cVar5;
    __lhs = __lhs + 1;
  } while( true );
}

Assistant:

void cmComputeLinkDepends::AddVarLinkEntries(int depender_index,
                                             const char* value)
{
  // This is called to add the dependencies named by
  // <item>_LIB_DEPENDS.  The variable contains a semicolon-separated
  // list.  The list contains link-type;item pairs and just items.
  std::vector<std::string> deplist;
  cmSystemTools::ExpandListArgument(value, deplist);

  // Look for entries meant for this configuration.
  std::vector<cmLinkItem> actual_libs;
  cmTargetLinkLibraryType llt = GENERAL_LibraryType;
  bool haveLLT = false;
  for (std::vector<std::string>::const_iterator di = deplist.begin();
       di != deplist.end(); ++di) {
    if (*di == "debug") {
      llt = DEBUG_LibraryType;
      haveLLT = true;
    } else if (*di == "optimized") {
      llt = OPTIMIZED_LibraryType;
      haveLLT = true;
    } else if (*di == "general") {
      llt = GENERAL_LibraryType;
      haveLLT = true;
    } else if (!di->empty()) {
      // If no explicit link type was given prior to this entry then
      // check if the entry has its own link type variable.  This is
      // needed for compatibility with dependency files generated by
      // the export_library_dependencies command from CMake 2.4 and
      // lower.
      if (!haveLLT) {
        std::string var = *di;
        var += "_LINK_TYPE";
        if (const char* val = this->Makefile->GetDefinition(var)) {
          if (strcmp(val, "debug") == 0) {
            llt = DEBUG_LibraryType;
          } else if (strcmp(val, "optimized") == 0) {
            llt = OPTIMIZED_LibraryType;
          }
        }
      }

      // If the library is meant for this link type then use it.
      if (llt == GENERAL_LibraryType || llt == this->LinkType) {
        cmLinkItem item(*di, this->FindTargetToLink(depender_index, *di));
        actual_libs.push_back(item);
      } else if (this->OldLinkDirMode) {
        cmLinkItem item(*di, this->FindTargetToLink(depender_index, *di));
        this->CheckWrongConfigItem(item);
      }

      // Reset the link type until another explicit type is given.
      llt = GENERAL_LibraryType;
      haveLLT = false;
    }
  }

  // Add the entries from this list.
  this->AddLinkEntries(depender_index, actual_libs);
}